

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_uncompress_chdr(backtrace_state *state,uchar *compressed,size_t compressed_size,
                       uint16_t *zdebug_table,backtrace_error_callback error_callback,void *data,
                       uchar **uncompressed,size_t *uncompressed_size)

{
  undefined8 uVar1;
  uchar *size;
  int iVar2;
  uchar *local_70;
  uchar *po;
  size_t alc_len;
  char *alc;
  b_elf_chdr chdr;
  void *data_local;
  backtrace_error_callback error_callback_local;
  uint16_t *zdebug_table_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  backtrace_state *state_local;
  
  *uncompressed = (uchar *)0x0;
  *uncompressed_size = 0;
  if (compressed_size < 0x18) {
    return 1;
  }
  uVar1 = *(undefined8 *)compressed;
  size = *(uchar **)(compressed + 8);
  alc_len = 0;
  po = (uchar *)0x0;
  if ((*uncompressed == (uchar *)0x0) || ((uchar *)*uncompressed_size < size)) {
    local_70 = (uchar *)tcmalloc_backtrace_alloc(state,(size_t)size,error_callback,data);
    po = size;
    alc_len = (size_t)local_70;
    if (local_70 == (uchar *)0x0) {
      return 0;
    }
  }
  else {
    local_70 = *uncompressed;
  }
  alc._0_4_ = (int)uVar1;
  if ((int)alc == 1) {
    iVar2 = elf_zlib_inflate_and_verify
                      (compressed + 0x18,compressed_size - 0x18,zdebug_table,local_70,(size_t)size);
  }
  else {
    if ((int)alc != 2) goto LAB_00151538;
    iVar2 = elf_zstd_decompress(compressed + 0x18,compressed_size - 0x18,(uchar *)zdebug_table,
                                local_70,(size_t)size);
  }
  if (iVar2 != 0) {
    *uncompressed = local_70;
    *uncompressed_size = (size_t)size;
    return 1;
  }
LAB_00151538:
  if ((alc_len != 0) && (po != (uchar *)0x0)) {
    tcmalloc_backtrace_free(state,(void *)alc_len,(size_t)po,error_callback,data);
  }
  return 1;
}

Assistant:

static int
elf_uncompress_chdr (struct backtrace_state *state,
		     const unsigned char *compressed, size_t compressed_size,
		     uint16_t *zdebug_table,
		     backtrace_error_callback error_callback, void *data,
		     unsigned char **uncompressed, size_t *uncompressed_size)
{
  b_elf_chdr chdr;
  char *alc;
  size_t alc_len;
  unsigned char *po;

  *uncompressed = NULL;
  *uncompressed_size = 0;

  /* The format starts with an ELF compression header.  */
  if (compressed_size < sizeof (b_elf_chdr))
    return 1;

  /* The lld linker can misalign a compressed section, so we can't safely read
     the fields directly as we can for other ELF sections.  See
     https://github.com/ianlancetaylor/libbacktrace/pull/120.  */
  memcpy (&chdr, compressed, sizeof (b_elf_chdr));

  alc = NULL;
  alc_len = 0;
  if (*uncompressed != NULL && *uncompressed_size >= chdr.ch_size)
    po = *uncompressed;
  else
    {
      alc_len = chdr.ch_size;
      alc = backtrace_alloc (state, alc_len, error_callback, data);
      if (alc == NULL)
	return 0;
      po = (unsigned char *) alc;
    }

  switch (chdr.ch_type)
    {
    case ELFCOMPRESS_ZLIB:
      if (!elf_zlib_inflate_and_verify (compressed + sizeof (b_elf_chdr),
					compressed_size - sizeof (b_elf_chdr),
					zdebug_table, po, chdr.ch_size))
	goto skip;
      break;

    case ELFCOMPRESS_ZSTD:
      if (!elf_zstd_decompress (compressed + sizeof (b_elf_chdr),
				compressed_size - sizeof (b_elf_chdr),
				(unsigned char *)zdebug_table, po,
				chdr.ch_size))
	goto skip;
      break;

    default:
      /* Unsupported compression algorithm.  */
      goto skip;
    }

  *uncompressed = po;
  *uncompressed_size = chdr.ch_size;

  return 1;

 skip:
  if (alc != NULL && alc_len > 0)
    backtrace_free (state, alc, alc_len, error_callback, data);
  return 1;
}